

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppFile.h
# Opt level: O0

void __thiscall cppforth::Forth::filePosition(Forth *this)

{
  byte bVar1;
  uint uVar2;
  element_type *peVar3;
  unsigned_long_long value;
  fpos local_78 [16];
  anon_union_8_4_a234c5df_for_data_ local_68;
  DCell position;
  iostate status;
  allocator<char> local_49;
  string local_48 [32];
  undefined1 local_28 [8];
  shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> f;
  uint h;
  Forth *this_local;
  
  requireDStackDepth(this,1,"FILE-POSITION");
  uVar2 = ForthStack<unsigned_int>::getTop(&this->dStack);
  f.
  super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = uVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_48,"FILE-POSITION",&local_49);
  GetFileHandle((Forth *)local_28,(Cell)this,(string *)(ulong)uVar2,(errorCodes)local_48);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  std::
  __shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)local_28);
  position.data_.Cells.lo = std::ios::rdstate();
  if (position.data_.Cells.lo != 0) {
    peVar3 = std::
             __shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_28);
    std::ios::clear((int)peVar3 + (int)*(undefined8 *)(*(long *)peVar3 + -0x18));
  }
  peVar3 = std::
           __shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_28);
  std::ios::clear((int)peVar3 + (int)*(undefined8 *)(*(long *)peVar3 + -0x18));
  std::
  __shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)local_28);
  local_78 = (fpos  [16])std::istream::tellg();
  value = std::fpos::operator_cast_to_long(local_78);
  DCell::DCell((DCell *)&local_68.Cells,value);
  std::
  __shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)local_28);
  position.data_.Cells.lo = std::ios::rdstate();
  ForthStack<unsigned_int>::setTop(&this->dStack,0,local_68.Cells.lo);
  ForthStack<unsigned_int>::push(&this->dStack,local_68.Cells.hi);
  std::
  __shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)local_28);
  bVar1 = std::ios::bad();
  uVar2 = 0;
  if ((bVar1 & 1) != 0) {
    uVar2 = 0xffffffbf;
  }
  ForthStack<unsigned_int>::push(&this->dStack,uVar2);
  std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>::~shared_ptr
            ((shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> *)local_28);
  return;
}

Assistant:

void filePosition() {
	REQUIRE_DSTACK_DEPTH(1, "FILE-POSITION");
	auto h = (dStack.getTop()); 
	auto f = GetFileHandle(h, "FILE-POSITION", errorFileSize);
	auto status = f->rdstate();
	if (status != 0) f->clear();
	f->clear();
	DCell position(f->tellg());
	status = f->rdstate();
	dStack.setTop(0, position.data_.Cells.lo);
	dStack.push(position.data_.Cells.hi);
	dStack.push(f->bad() ? Cell(errorFilePosition) : 0);
}